

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O3

void itrans_dct2_h16_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  int iVar9;
  bool bVar10;
  long lVar11;
  uint uVar12;
  undefined1 (*pauVar13) [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  s16 tmp [128];
  s16 local_140 [8];
  undefined1 local_130 [16];
  undefined1 auStack_120 [32];
  undefined1 auStack_100 [32];
  undefined1 auStack_e0 [32];
  undefined1 auStack_c0 [32];
  undefined1 auStack_a0 [32];
  undefined1 auStack_80 [32];
  undefined1 auStack_60 [64];
  
  dct2_butterfly_h16_avx2(src,8,local_140,8,5,0xf);
  iVar9 = 1 << (0x13U - (char)bit_depth & 0x1f);
  uVar12 = 0x14 - bit_depth;
  auVar14._4_4_ = iVar9;
  auVar14._0_4_ = iVar9;
  auVar14._8_4_ = iVar9;
  auVar14._12_4_ = iVar9;
  auVar14._16_4_ = iVar9;
  auVar14._20_4_ = iVar9;
  auVar14._24_4_ = iVar9;
  auVar14._28_4_ = iVar9;
  lVar11 = 0;
  auVar20._8_4_ = 0xffd40026;
  auVar20._0_8_ = 0xffd40026ffd40026;
  auVar20._12_4_ = 0xffd40026;
  auVar20._16_4_ = 0xffd40026;
  auVar20._20_4_ = 0xffd40026;
  auVar20._24_4_ = 0xffd40026;
  auVar20._28_4_ = 0xffd40026;
  auVar21._8_2_ = 0x20;
  auVar21._0_8_ = 0x20002000200020;
  auVar21._10_2_ = 0x20;
  auVar21._12_2_ = 0x20;
  auVar21._14_2_ = 0x20;
  auVar21._16_2_ = 0x20;
  auVar21._18_2_ = 0x20;
  auVar21._20_2_ = 0x20;
  auVar21._22_2_ = 0x20;
  auVar21._24_2_ = 0x20;
  auVar21._26_2_ = 0x20;
  auVar21._28_2_ = 0x20;
  auVar21._30_2_ = 0x20;
  auVar22._8_4_ = 0xffe00020;
  auVar22._0_8_ = 0xffe00020ffe00020;
  auVar22._12_4_ = 0xffe00020;
  auVar22._16_4_ = 0xffe00020;
  auVar22._20_4_ = 0xffe00020;
  auVar22._24_4_ = 0xffe00020;
  auVar22._28_4_ = 0xffe00020;
  auVar23._8_4_ = 0x11002a;
  auVar23._0_8_ = 0x11002a0011002a;
  auVar23._12_4_ = 0x11002a;
  auVar23._16_4_ = 0x11002a;
  auVar23._20_4_ = 0x11002a;
  auVar23._24_4_ = 0x11002a;
  auVar23._28_4_ = 0x11002a;
  auVar24._8_4_ = 0xffd60011;
  auVar24._0_8_ = 0xffd60011ffd60011;
  auVar24._12_4_ = 0xffd60011;
  auVar24._16_4_ = 0xffd60011;
  auVar24._20_4_ = 0xffd60011;
  auVar24._24_4_ = 0xffd60011;
  auVar24._28_4_ = 0xffd60011;
  pauVar13 = (undefined1 (*) [16])local_140;
  bVar8 = true;
  do {
    bVar10 = bVar8;
    auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_120 + lVar11 * 2),
                            *(undefined1 (*) [16])(auStack_e0 + lVar11 * 2));
    auVar25 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_120 + lVar11 * 2),
                             *(undefined1 (*) [16])(auStack_e0 + lVar11 * 2));
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_a0 + lVar11 * 2),
                            *(undefined1 (*) [16])(auStack_60 + lVar11 * 2));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_a0 + lVar11 * 2),
                            *(undefined1 (*) [16])(auStack_60 + lVar11 * 2));
    auVar16._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar2;
    auVar16._16_16_ = ZEXT116(1) * auVar25;
    auVar4 = vpmaddwd_avx2(auVar16,_DAT_00184ac0);
    auVar26._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar26._16_16_ = ZEXT116(1) * auVar1;
    auVar5 = vpmaddwd_avx2(auVar26,_DAT_00184ae0);
    auVar4 = vpaddd_avx2(auVar5,auVar4);
    auVar5 = vpmaddwd_avx2(auVar16,_DAT_00184b00);
    auVar18 = vpmaddwd_avx2(auVar26,_DAT_00184b20);
    auVar5 = vpaddd_avx2(auVar18,auVar5);
    auVar18 = vpmaddwd_avx2(auVar16,_DAT_00184b40);
    auVar6 = vpmaddwd_avx2(auVar26,_DAT_00184b60);
    auVar18 = vpaddd_avx2(auVar6,auVar18);
    auVar6 = vpmaddwd_avx2(auVar16,_DAT_00184b80);
    auVar16 = vpmaddwd_avx2(auVar26,auVar20);
    auVar6 = vpaddd_avx2(auVar16,auVar6);
    auVar2 = vpunpcklwd_avx(*pauVar13,*(undefined1 (*) [16])(auStack_c0 + lVar11 * 2));
    auVar25 = vpunpckhwd_avx(*pauVar13,*(undefined1 (*) [16])(auStack_c0 + lVar11 * 2));
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(auStack_100 + lVar11 * 2),
                            *(undefined1 (*) [16])(auStack_80 + lVar11 * 2));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(auStack_100 + lVar11 * 2),
                            *(undefined1 (*) [16])(auStack_80 + lVar11 * 2));
    auVar17._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar2;
    auVar17._16_16_ = ZEXT116(1) * auVar25;
    auVar16 = vpmaddwd_avx2(auVar21,auVar17);
    auVar19 = vpmaddwd_avx2(auVar22,auVar17);
    auVar15._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar15._16_16_ = ZEXT116(1) * auVar1;
    auVar17 = vpmaddwd_avx2(auVar23,auVar15);
    auVar15 = vpmaddwd_avx2(auVar24,auVar15);
    auVar26 = vpsubd_avx2(auVar16,auVar17);
    auVar16 = vpaddd_avx2(auVar16,auVar14);
    auVar16 = vpaddd_avx2(auVar16,auVar17);
    auVar7 = vpsubd_avx2(auVar19,auVar15);
    auVar17 = vpaddd_avx2(auVar26,auVar14);
    auVar19 = vpaddd_avx2(auVar19,auVar14);
    auVar19 = vpaddd_avx2(auVar19,auVar15);
    auVar15 = vpaddd_avx2(auVar7,auVar14);
    auVar26 = vpaddd_avx2(auVar4,auVar16);
    auVar7 = vpsubd_avx2(auVar16,auVar4);
    auVar16 = vpaddd_avx2(auVar19,auVar5);
    auVar19 = vpsubd_avx2(auVar19,auVar5);
    auVar4 = vpaddd_avx2(auVar15,auVar18);
    auVar15 = vpsubd_avx2(auVar15,auVar18);
    auVar5 = vpaddd_avx2(auVar6,auVar17);
    auVar18 = vpsrad_avx2(auVar19,ZEXT416(uVar12));
    auVar19 = vpsubd_avx2(auVar17,auVar6);
    auVar4 = vpsrad_avx2(auVar4,ZEXT416(uVar12));
    auVar4 = vpackssdw_avx2(auVar4,auVar18);
    auVar25 = ZEXT416(uVar12);
    auVar18 = vpsrad_avx2(auVar7,auVar25);
    auVar6 = vpsrad_avx2(auVar16,auVar25);
    auVar16 = vpsrad_avx2(auVar15,auVar25);
    auVar17 = vpsrad_avx2(auVar5,auVar25);
    auVar5 = vpackssdw_avx2(auVar6,auVar16);
    auVar18 = vpackssdw_avx2(auVar17,auVar18);
    auVar6 = vpsrad_avx2(auVar26,ZEXT416(uVar12));
    auVar16 = vpsrad_avx2(auVar19,ZEXT416(uVar12));
    auVar6 = vpackssdw_avx2(auVar6,auVar16);
    auVar16 = vpunpcklwd_avx2(auVar6,auVar4);
    auVar4 = vpunpckhwd_avx2(auVar6,auVar4);
    auVar6 = vpunpcklwd_avx2(auVar5,auVar18);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar18);
    auVar17 = vpunpcklwd_avx2(auVar16,auVar6);
    auVar18 = vpunpckhwd_avx2(auVar16,auVar6);
    auVar6 = vpunpcklwd_avx2(auVar4,auVar5);
    auVar4 = vpunpckhwd_avx2(auVar4,auVar5);
    auVar16 = vpunpcklqdq_avx2(auVar17,auVar6);
    auVar5 = vpunpckhqdq_avx2(auVar17,auVar6);
    auVar6 = vpunpcklqdq_avx2(auVar18,auVar4);
    auVar4 = vpunpckhqdq_avx2(auVar18,auVar4);
    auVar19._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar16._0_16_;
    auVar19._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar5._0_16_;
    auVar5 = vperm2i128_avx2(auVar16,auVar5,0x31);
    auVar18._0_16_ = ZEXT116(0) * auVar4._0_16_ + ZEXT116(1) * auVar6._0_16_;
    auVar18._16_16_ = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar4._0_16_;
    auVar4 = vperm2i128_avx2(auVar6,auVar4,0x31);
    *(undefined1 (*) [32])dst = auVar19;
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar18;
    *(undefined1 (*) [32])((long)dst + 0x40) = auVar5;
    *(undefined1 (*) [32])((long)dst + 0x60) = auVar4;
    dst = (s16 *)((long)dst + 0x80);
    lVar11 = 8;
    pauVar13 = &local_130;
    bVar8 = false;
  } while (bVar10);
  return;
}

Assistant:

void itrans_dct2_h16_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[16 * 8]);
    dct2_butterfly_h16_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 16, dst, 16, 20 - bit_depth, bit_depth);
}